

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_0::GetEnumValidationRange
               (EnumDescriptor *enum_type,int16_t *start,uint16_t *size)

{
  bool bVar1;
  int start_value;
  int iVar2;
  EnumValueDescriptor *this;
  uint16_t *size_local;
  int16_t *start_local;
  EnumDescriptor *enum_type_local;
  
  bVar1 = IsEnumFullySequential(enum_type);
  if (bVar1) {
    this = EnumDescriptor::value(enum_type,0);
    start_value = EnumValueDescriptor::number(this);
    iVar2 = EnumDescriptor::value_count(enum_type);
    enum_type_local._7_1_ = SetEnumValidationRange(start_value,(long)iVar2,start,size);
  }
  else {
    enum_type_local._7_1_ = GetEnumValidationRangeSlow(enum_type,start,size);
  }
  return enum_type_local._7_1_;
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int16_t& start,
                            uint16_t& size) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, start, size);
  }

  return SetEnumValidationRange(enum_type->value(0)->number(),
                                enum_type->value_count(), start, size);
}